

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> * __thiscall
cnn::Tensor::batch_elems
          (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__return_storage_ptr__,Tensor *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint b;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Tensor local_78;
  
  uVar6 = (ulong)(this->d).bd;
  if (uVar6 == 1) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,1,this,(allocator_type *)&local_78);
  }
  else {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,uVar6,(allocator_type *)&local_78);
    uVar5 = Dim::batch_size(&this->d);
    uVar1 = *(undefined8 *)(this->d).d;
    uVar2 = *(undefined8 *)((this->d).d + 2);
    uVar3 = *(undefined8 *)((this->d).d + 4);
    uVar4 = *(undefined8 *)((this->d).d + 6);
    lVar7 = 0;
    uVar8 = 0;
    for (uVar6 = 0; uVar6 < (this->d).bd; uVar6 = uVar6 + 1) {
      local_78.v = this->v + uVar8;
      local_78.d.bd = 1;
      local_78.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.d.d._0_8_ = uVar1;
      local_78.d.d._8_8_ = uVar2;
      local_78.d.d._16_8_ = uVar3;
      local_78.d._24_8_ = uVar4;
      operator=((Tensor *)
                ((long)(((__return_storage_ptr__->
                         super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                         super__Vector_impl_data._M_start)->d).d + lVar7),&local_78);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_78.bs);
      uVar8 = (ulong)((int)uVar8 + uVar5);
      lVar7 = lVar7 + 0x48;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tensor> batch_elems() const {
    if(d.batch_elems() == 1) {
      return std::vector<Tensor>(1, *this); 
    } else {
      std::vector<Tensor> bs(d.batch_elems());
      unsigned bsize = d.batch_size();
      Dim new_d = d; new_d.bd = 1;
      assert (d.batch_elems() >= 0);
      for(unsigned b = 0; b < d.batch_elems(); ++b)
        bs[b] = Tensor(new_d, v + bsize * b);
      return bs;
    }
  }